

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::Encode
          (GED_EnhancedGroundCombatSoldier *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_EnhancedGroundCombatSoldier *this_local;
  
  GED_BasicGroundCombatSoldier::Encode(&this->super_GED_BasicGroundCombatSoldier,stream);
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8WaterStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8RestStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8PriAmmun);
  KDataStream::operator<<(pKVar1,this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedGroundCombatSoldier::Encode( KDataStream & stream ) const
{
    GED_BasicGroundCombatSoldier::Encode( stream );

    stream << m_ui8WaterStatus
           << m_ui8RestStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}